

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cuboctahedron.cpp
# Opt level: O3

void __thiscall
OpenMD::Cuboctahedron::Cuboctahedron(Cuboctahedron *this,string *lattice,int cells,int planes)

{
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  pointer pcVar1;
  int iVar2;
  Vector3<double> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_Cuboctahedron = (_func_int **)&PTR__Cuboctahedron_0022b9b0;
  local_38 = &(this->lattice_).field_2;
  (this->lattice_)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (lattice->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lattice_,pcVar1,pcVar1 + lattice->_M_string_length);
  this->L_ = cells;
  this->M_ = planes;
  this_00 = &this->Basis;
  (this->Points).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Points).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Points).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Basis).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Basis).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Basis).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::locale::locale((locale *)&local_58);
  toUpper<std::__cxx11::string>(lattice,(locale *)&local_58);
  std::locale::~locale((locale *)&local_58);
  iVar2 = std::__cxx11::string::compare((char *)lattice);
  if (iVar2 == 0) {
    local_58.super_Vector<double,_3U>.data_[0] = 0.0;
    local_58.super_Vector<double,_3U>.data_[1] = 0.0;
    local_58.super_Vector<double,_3U>.data_[2] = 0.0;
    std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
    emplace_back<OpenMD::Vector3<double>>
              ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
               &local_58);
    local_58.super_Vector<double,_3U>.data_[0] = 0.5;
    local_58.super_Vector<double,_3U>.data_[1] = 0.5;
    local_58.super_Vector<double,_3U>.data_[2] = 0.5;
    std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
    emplace_back<OpenMD::Vector3<double>>
              ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
               &local_58);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)lattice);
    if (iVar2 == 0) {
      local_58.super_Vector<double,_3U>.data_[0] = 0.0;
      local_58.super_Vector<double,_3U>.data_[1] = 0.0;
      local_58.super_Vector<double,_3U>.data_[2] = 0.0;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 &local_58);
    }
    else {
      local_58.super_Vector<double,_3U>.data_[0] = 0.0;
      local_58.super_Vector<double,_3U>.data_[1] = 0.0;
      local_58.super_Vector<double,_3U>.data_[2] = 0.0;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 &local_58);
      local_58.super_Vector<double,_3U>.data_[0] = 0.5;
      local_58.super_Vector<double,_3U>.data_[1] = 0.5;
      local_58.super_Vector<double,_3U>.data_[2] = 0.0;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 &local_58);
      local_58.super_Vector<double,_3U>.data_[0] = 0.5;
      local_58.super_Vector<double,_3U>.data_[1] = 0.0;
      local_58.super_Vector<double,_3U>.data_[2] = 0.5;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 &local_58);
      local_58.super_Vector<double,_3U>.data_[0] = 0.0;
      local_58.super_Vector<double,_3U>.data_[1] = 0.5;
      local_58.super_Vector<double,_3U>.data_[2] = 0.5;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 &local_58);
    }
  }
  return;
}

Assistant:

Cuboctahedron::Cuboctahedron(std::string lattice, int cells, int planes) :
      lattice_(lattice), L_(cells), M_(planes) {
    Basis.clear();
    Points.clear();

    //
    // Initialize Basis vectors.
    //
    toUpper(lattice);

    if (lattice == "BCC") {
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
      Basis.push_back(Vector3d(0.5, 0.5, 0.5));
    } else if (lattice == "SC") {
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
    } else {
      // Default is FCC:
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
      Basis.push_back(Vector3d(0.5, 0.5, 0.0));
      Basis.push_back(Vector3d(0.5, 0.0, 0.5));
      Basis.push_back(Vector3d(0.0, 0.5, 0.5));
    }
  }